

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x86func.cpp
# Opt level: O2

void asmjit::v1_14::x86::FuncInternal::unpackValues(FuncDetail *func,FuncValuePack *pack)

{
  uint uVar1;
  
  uVar1 = pack->_values[0]._data;
  if (((uVar1 & 0xfe) == 0x28) && (((byte)*func & 1) != 0)) {
    pack->_values[0]._data = 0x27;
    pack->_values[1]._data = uVar1 + 0x3e & 0x27;
  }
  return;
}

Assistant:

ASMJIT_FAVOR_SIZE void unpackValues(FuncDetail& func, FuncValuePack& pack) noexcept {
  TypeId typeId = pack[0].typeId();
  switch (typeId) {
    case TypeId::kInt64:
    case TypeId::kUInt64: {
      if (Environment::is32Bit(func.callConv().arch())) {
        // Convert a 64-bit return value to two 32-bit return values.
        pack[0].initTypeId(TypeId::kUInt32);
        pack[1].initTypeId(TypeId(uint32_t(typeId) - 2));
        break;
      }
      break;
    }

    default: {
      break;
    }
  }
}